

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char>
fmt::v7::detail::
write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>
          (buffer_appender<char> out,decimal_fp<double> *fp,basic_format_specs<char> *specs,
          float_specs fspecs,char decimal_point)

{
  uint uVar1;
  int value;
  type tVar2;
  buffer_appender<char> bVar3;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint value_00;
  undefined3 in_register_00000081;
  char cVar8;
  ulong uVar9;
  size_t size;
  bool bVar10;
  char local_cd;
  int num_zeros;
  sign_t sign;
  int significand_size;
  basic_format_specs<char> *local_c0;
  ulong local_b8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_b0;
  undefined4 local_a4;
  float_specs fspecs_local;
  significand_type significand;
  int local_90;
  int exp;
  ulong local_88;
  significand_type local_80;
  anon_class_40_7_ef14d3db write;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  local_a4 = CONCAT31(in_register_00000081,decimal_point);
  significand = fp->significand;
  local_cd = decimal_point;
  local_c0 = specs;
  local_b0 = out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  fspecs_local = fspecs;
  local_80 = significand;
  value = get_significand_size<double>(fp);
  uVar9 = (ulong)fspecs >> 0x20;
  uVar1 = fspecs._4_4_;
  sign = uVar1 >> 8 & 0xff;
  bVar10 = sign != none;
  significand_size = value;
  tVar2 = to_unsigned<int>(value);
  local_b8 = (ulong)(bVar10 + tVar2);
  iVar5 = fp->exponent;
  local_90 = value + -1 + iVar5;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_90;
  bVar10 = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
           ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  iVar7 = fspecs.precision;
  if (bVar10) {
    iVar5 = iVar5 + value;
    local_88 = uVar9;
    if ((uVar1 >> 0x14 & 1) == 0) {
      value_00 = 0;
      cVar8 = (char)local_a4;
      uVar9 = local_b8;
      if (value == 1) {
        cVar8 = '\0';
      }
    }
    else {
      value_00 = ~(iVar7 - value >> 0x1f) & iVar7 - value;
      tVar2 = to_unsigned<int>(value_00);
      cVar8 = (char)local_a4;
      uVar9 = local_b8 + tVar2;
    }
    iVar6 = local_90;
    iVar7 = 1 - iVar5;
    if (0 < iVar5) {
      iVar7 = local_90;
    }
    iVar5 = 2;
    if (99 < iVar7) {
      iVar5 = (999 < iVar7) + 3;
    }
    tVar2 = to_unsigned<int>((3 - (uint)(cVar8 == '\0')) + iVar5);
    write._0_8_ = CONCAT44(write._4_4_,uVar1 >> 8) & 0xffffffff000000ff;
    write.significand = local_80;
    write.decimal_point = cVar8;
    write.significand_size = value;
    write._24_8_ = CONCAT35(write._29_3_,CONCAT14((((uint)local_88 >> 0x10 & 1) == 0) << 5,value_00)
                           ) | 0x4500000000;
    write.output_exp = iVar6;
    if (0 < local_c0->width) {
      bVar3 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_&>
                        ((buffer_appender<char>)local_b0.container,local_c0,tVar2 + uVar9,&write);
      return (buffer_appender<char>)
             bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    bVar3 = reserve<char>((buffer_appender<char>)local_b0.container,tVar2 + uVar9);
    bVar3 = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
            ::anon_class_40_7_ef14d3db::operator()
                      (&write,(iterator)
                              bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container);
    return (buffer_appender<char>)
           bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
  }
  iVar6 = fp->exponent;
  iVar5 = value + iVar6;
  exp = iVar5;
  if (iVar6 < 0) {
    if (0 < iVar5) {
      num_zeros = iVar7 - value & (int)(uVar1 << 0xb) >> 0x1f;
      tVar2 = to_unsigned<int>(~(num_zeros >> 0x1f) & num_zeros);
      write._0_8_ = &sign;
      write.significand = (significand_type)&significand;
      write._16_8_ = &significand_size;
      write._24_8_ = &exp;
      write._32_8_ = &local_cd;
      bVar3 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_3_>
                        ((buffer_appender<char>)local_b0.container,local_c0,(tVar2 + 1) + local_b8,
                         (anon_class_48_6_48d028d1 *)&write);
      return (buffer_appender<char>)
             bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    iVar6 = -iVar5;
    num_zeros = iVar6;
    if (SBORROW4(iVar7,iVar6) != iVar7 + iVar5 < 0) {
      num_zeros = iVar7;
    }
    if (iVar7 < 0) {
      num_zeros = iVar6;
    }
    if (value != 0) {
      num_zeros = iVar6;
    }
    tVar2 = to_unsigned<int>(num_zeros);
    write._0_8_ = &sign;
    write._16_8_ = &significand_size;
    write._24_8_ = &fspecs_local;
    write._32_8_ = &local_cd;
    write.significand = (significand_type)&num_zeros;
    bVar4.container =
         (buffer<char> *)
         write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_4_>
                   (local_b0.container,local_c0,(tVar2 + 2) + local_b8,
                    (anon_class_48_6_9afe1116 *)&write);
    return (buffer_appender<char>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar4.container;
  }
  tVar2 = to_unsigned<int>(iVar6);
  size = tVar2 + local_b8;
  num_zeros = fspecs_local.precision - iVar5;
  if (((uint)fspecs_local._4_4_ >> 0x14 & 1) != 0) {
    if (fspecs_local._4_1_ == '\x02' || 0 < num_zeros) {
      if (num_zeros < 1) goto LAB_001119c3;
    }
    else {
      num_zeros = 1;
    }
    tVar2 = to_unsigned<int>(num_zeros);
    size = size + tVar2;
  }
LAB_001119c3:
  write._0_8_ = &sign;
  write.significand = (significand_type)&significand;
  write._16_8_ = &significand_size;
  write._32_8_ = &fspecs_local;
  write._24_8_ = fp;
  bVar3 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_2_>
                    ((buffer_appender<char>)local_b0.container,local_c0,size,
                     (anon_class_56_7_a2a26a24 *)&write);
  return (buffer_appender<char>)
         bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}